

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simultan.c
# Opt level: O3

void lin_state_term(Item *q1,Item *q2)

{
  int iVar1;
  Symbol *pSVar2;
  uint uVar3;
  
  statsym = (q1->element).sym;
  replacstr(q1,"1.0");
  if ((statsym->subtype & 0x20) != 0) {
    indexstr = qconcat(q1->next->next,q2->prev);
    deltokens(q1->next,q2->prev);
    replacstr(q2,"");
  }
  pSVar2 = statsym;
  iVar1 = nstate;
  if (statsym->used == 1) {
    statsym->varnum = nstate;
    if ((pSVar2->subtype & 0x20) == 0) {
      sprintf(buf,"_slist%d[%d] = &(%s) - _p;\n",(ulong)(uint)numlist,(ulong)(uint)iVar1,
              pSVar2->name);
      uVar3 = 1;
    }
    else {
      uVar3 = pSVar2->araydim;
      using_array = 1;
      sprintf(buf,"for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n",(ulong)uVar3,
              (ulong)(uint)numlist,(ulong)(uint)iVar1,pSVar2->name);
    }
    nstate = nstate + uVar3;
    lappendstr(initlist,buf);
    return;
  }
  return;
}

Assistant:

void lin_state_term(q1, q2) /* term last*/
	Item *q1, *q2;
{
	char *qconcat(); /* but puts extra ) at end */
	
	statsym = SYM(q1);
	replacstr(q1, "1.0");
	if (statsym->subtype & ARRAY) { 
		indexstr = qconcat(q1->next->next, q2->prev);
		deltokens(q1->next, q2->prev); /*can't erase lastok*/
		replacstr(q2, "");
	}
	if (statsym->used == 1) {
		statsym->varnum = nstate;
		if (statsym->subtype & ARRAY) {int dim = statsym->araydim;
			using_array=1;
		        Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;}\n"
		                ,dim, numlist , nstate, statsym->name);
			nstate += dim;
		}else{
			Sprintf(buf, "_slist%d[%d] = &(%s) - _p;\n",
				numlist, nstate, statsym->name);
			nstate++;
		}
	        Lappendstr(initlist, buf);
	}
}